

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O0

void __thiscall QIODevicePrivate::setWriteChannelCount(QIODevicePrivate *this,int count)

{
  long sz;
  size_type sVar1;
  int in_ESI;
  QVarLengthArray<QRingBuffer,_1LL> *in_RDI;
  int *in_stack_ffffffffffffffd8;
  int channel;
  undefined4 in_stack_fffffffffffffff0;
  
  sz = (long)in_ESI;
  sVar1 = QVLABaseBase::size((QVLABaseBase *)
                             (in_RDI[3].super_QVLAStorage<40UL,_8UL,_1LL>.array + 0x20));
  if (sVar1 < sz) {
    if (*(int *)(in_RDI[1].super_QVLAStorage<40UL,_8UL,_1LL>.array + 0xc) != 0) {
      QVarLengthArray<QRingBuffer,_1LL>::reserve
                ((QVarLengthArray<QRingBuffer,_1LL> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),sz)
      ;
      while (sVar1 = QVLABaseBase::size((QVLABaseBase *)
                                        (in_RDI[3].super_QVLAStorage<40UL,_8UL,_1LL>.array + 0x20)),
            sVar1 < in_ESI) {
        QVarLengthArray<QRingBuffer,1ll>::emplace_back<int&>(in_RDI,in_stack_ffffffffffffffd8);
      }
    }
    channel = (int)((ulong)sz >> 0x20);
  }
  else {
    QVarLengthArray<QRingBuffer,_1LL>::resize(in_RDI,(qsizetype)in_stack_ffffffffffffffd8);
    channel = (int)((ulong)sz >> 0x20);
  }
  *(int *)((long)&(in_RDI->super_QVLABase<QRingBuffer>).super_QVLABaseBase.ptr + 4) = in_ESI;
  setCurrentWriteChannel((QIODevicePrivate *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),channel);
  return;
}

Assistant:

void QIODevicePrivate::setWriteChannelCount(int count)
{
    if (count > writeBuffers.size()) {
        // If writeBufferChunkSize is zero (default value), we don't use
        // QIODevice's write buffers.
        if (writeBufferChunkSize != 0) {
            writeBuffers.reserve(count);
            while (writeBuffers.size() < count)
                writeBuffers.emplace_back(writeBufferChunkSize);
        }
    } else {
        writeBuffers.resize(count);
    }
    writeChannelCount = count;
    setCurrentWriteChannel(currentWriteChannel);
}